

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderLibraryCase.cpp
# Opt level: O3

int __thiscall deqp::gls::ShaderLibraryCase::init(ShaderLibraryCase *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  ContextInfo *pCVar2;
  bool bVar3;
  ContextType type;
  int iVar4;
  pointer pRVar5;
  long *plVar6;
  NotSupportedError *this_00;
  char *__s;
  size_type *psVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  int supportedValue;
  int requiredValue;
  int local_2a0;
  int local_29c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  string local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  string local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  undefined1 local_1b8 [8];
  _func_int **local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [6];
  ios_base local_140 [264];
  code *local_38;
  uint local_30;
  
  type.super_ApiType.m_bits = (ApiType)(*this->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::isGLSLVersionSupported(type,(this->m_spec).targetVersion);
  if (!bVar3) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    __s = glu::getGLSLVersionName((this->m_spec).targetVersion);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_298,__s,(allocator<char> *)&local_238);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_1b8 = (undefined1  [8])*plVar6;
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar6 + 2);
    if (local_1b8 == (undefined1  [8])paVar8) {
      local_1a8[0]._0_8_ = paVar8->_M_allocated_capacity;
      local_1a8[0]._8_8_ = plVar6[3];
      local_1b8 = (undefined1  [8])local_1a8;
    }
    else {
      local_1a8[0]._0_8_ = paVar8->_M_allocated_capacity;
    }
    local_1b0 = (_func_int **)plVar6[1];
    *plVar6 = (long)paVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    tcu::NotSupportedError::NotSupportedError
              (this_00,(char *)local_1b8,(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsShaderLibraryCase.cpp"
               ,0x2dc);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  pRVar5 = (this->m_spec).requiredCaps.
           super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_spec).requiredCaps.
      super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>.
      _M_impl.super__Vector_impl_data._M_finish != pRVar5) {
    pCVar2 = this->m_contextInfo;
    uVar9 = 0;
    do {
      uVar1 = pRVar5[uVar9].enumName;
      iVar4 = pRVar5[uVar9].referenceValue;
      local_29c = iVar4;
      local_2a0 = (*pCVar2->_vptr_ContextInfo[2])(pCVar2,(ulong)uVar1);
      if (local_2a0 <= iVar4) {
        auVar10 = __cxa_allocate_exception(0x38);
        local_38 = glu::getGettableStateName;
        local_30 = uVar1;
        de::toString<tcu::Format::Enum<int,2ul>>(&local_258,(de *)&local_38,auVar10._8_8_);
        std::operator+(&local_1d8,"Test requires ",&local_258);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_1d8);
        local_278._M_dataplus._M_p = (pointer)*plVar6;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_278._M_dataplus._M_p == psVar7) {
          local_278.field_2._M_allocated_capacity = *psVar7;
          local_278.field_2._8_8_ = plVar6[3];
          local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        }
        else {
          local_278.field_2._M_allocated_capacity = *psVar7;
        }
        local_278._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        de::toString<int>(&local_1f8,&local_2a0);
        std::operator+(&local_238,&local_278,&local_1f8);
        plVar6 = (long *)std::__cxx11::string::append((char *)&local_238);
        local_298._M_dataplus._M_p = (pointer)*plVar6;
        psVar7 = (size_type *)(plVar6 + 2);
        if ((size_type *)local_298._M_dataplus._M_p == psVar7) {
          local_298.field_2._M_allocated_capacity = *psVar7;
          local_298.field_2._8_8_ = plVar6[3];
          local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
        }
        else {
          local_298.field_2._M_allocated_capacity = *psVar7;
        }
        local_298._M_string_length = plVar6[1];
        *plVar6 = (long)psVar7;
        plVar6[1] = 0;
        *(undefined1 *)(plVar6 + 2) = 0;
        de::toString<int>(&local_218,&local_29c);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1b8,&local_298,&local_218);
        tcu::NotSupportedError::NotSupportedError(auVar10._0_8_,(string *)local_1b8);
        __cxa_throw(auVar10._0_8_,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
      }
      uVar9 = uVar9 + 1;
      pRVar5 = (this->m_spec).requiredCaps.
               super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar9 < (ulong)((long)(this->m_spec).requiredCaps.
                                   super__Vector_base<glu::sl::RequiredCapability,_std::allocator<glu::sl::RequiredCapability>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pRVar5 >> 3));
  }
  iVar4 = (this->m_spec).expectResult - EXPECT_COMPILE_FAIL;
  switch(iVar4) {
  case 0:
    local_1b8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"Expecting shader compilation to fail.",0x25);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case 1:
    local_1b8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"Expecting program linking to fail.",0x22);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case 2:
    local_1b8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,
               "Expecting either shader compilation or program linking to fail.",0x3f);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case 3:
    local_1b8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,"Expecting program validation to fail.",0x25);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  case 4:
    local_1b8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b0,
               "Expecting shader compilation and program linking to succeed. Resulting program will not be executed."
               ,100);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    break;
  default:
    goto switchD_0181eff4_default;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0);
  iVar4 = std::ios_base::~ios_base(local_140);
switchD_0181eff4_default:
  return iVar4;
}

Assistant:

void ShaderLibraryCase::init (void)
{
	DE_ASSERT(isValid(m_spec));

	if (!isGLSLVersionSupported(m_renderCtx.getType(), m_spec.targetVersion))
		TCU_THROW(NotSupportedError, (string(getGLSLVersionName(m_spec.targetVersion)) + " is not supported").c_str());

	checkImplementationLimits(m_spec.requiredCaps, m_contextInfo);

	// log the expected result
	switch (m_spec.expectResult)
	{
		case EXPECT_PASS:
			// Don't write anything
			break;

		case EXPECT_COMPILE_FAIL:
			m_testCtx.getLog() << tcu::TestLog::Message << "Expecting shader compilation to fail." << tcu::TestLog::EndMessage;
			break;

		case EXPECT_LINK_FAIL:
			m_testCtx.getLog() << tcu::TestLog::Message << "Expecting program linking to fail." << tcu::TestLog::EndMessage;
			break;

		case EXPECT_COMPILE_LINK_FAIL:
			m_testCtx.getLog() << tcu::TestLog::Message << "Expecting either shader compilation or program linking to fail." << tcu::TestLog::EndMessage;
			break;

		case EXPECT_VALIDATION_FAIL:
			m_testCtx.getLog() << tcu::TestLog::Message << "Expecting program validation to fail." << tcu::TestLog::EndMessage;
			break;

		case EXPECT_BUILD_SUCCESSFUL:
			m_testCtx.getLog() << tcu::TestLog::Message << "Expecting shader compilation and program linking to succeed. Resulting program will not be executed." << tcu::TestLog::EndMessage;
			break;

		default:
			DE_ASSERT(false);
			break;
	}
}